

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThermoIntegrationForceModifier.cpp
# Opt level: O1

void __thiscall
OpenMD::ThermoIntegrationForceModifier::modifyForces(ThermoIntegrationForceModifier *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  Snapshot *pSVar5;
  RealType RVar6;
  undefined8 uVar7;
  Molecule *pMVar8;
  double (*padVar9) [3];
  uint i_2;
  pointer ppSVar10;
  uint j;
  StuntDouble *pSVar11;
  uint i;
  long lVar12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Vector3d trq;
  Vector3d frc;
  MoleculeIterator mi;
  Mat3x3d tempTau;
  double local_f8 [4];
  double local_d8 [4];
  RealType local_b8;
  MoleculeIterator local_b0;
  Mat3x3d local_a8;
  Mat3x3d local_58;
  
  local_b0._M_node = (_Base_ptr)0x0;
  local_d8[2] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_f8[2] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  pMVar8 = SimInfo::beginMolecule
                     ((this->super_RestraintForceModifier).super_ForceModifier.info_,&local_b0);
  if (pMVar8 != (Molecule *)0x0) {
    do {
      ppSVar10 = (pMVar8->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (ppSVar10 ==
            (pMVar8->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar11 = (StuntDouble *)0x0;
        }
        else {
          pSVar11 = *ppSVar10;
        }
        if (pSVar11 == (StuntDouble *)0x0) break;
        lVar12 = *(long *)((long)&(pSVar11->snapshotMan_->currentSnapshot_->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
        local_d8[2] = (double)*(undefined8 *)(lVar12 + 0x10 + (long)pSVar11->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar12 + (long)pSVar11->localIndex_ * 0x18);
        local_d8[0] = *pdVar1;
        local_d8[1] = pdVar1[1];
        dVar2 = this->factor_;
        lVar12 = 0;
        do {
          local_d8[lVar12] = local_d8[lVar12] * dVar2;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        pSVar5 = pSVar11->snapshotMan_->currentSnapshot_;
        lVar13 = (long)pSVar11->localIndex_;
        lVar12 = *(long *)((long)&(pSVar5->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
        *(double *)(lVar12 + 0x10 + lVar13 * 0x18) = local_d8[2];
        pdVar1 = (double *)(lVar12 + lVar13 * 0x18);
        *pdVar1 = local_d8[0];
        pdVar1[1] = local_d8[1];
        if (pSVar11->objType_ - otDAtom < 2) {
          lVar12 = *(long *)((long)&(pSVar5->atomData).torque.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
          local_f8[2] = (double)*(undefined8 *)(lVar12 + 0x10 + lVar13 * 0x18);
          pdVar1 = (double *)(lVar12 + lVar13 * 0x18);
          local_f8[0] = *pdVar1;
          local_f8[1] = pdVar1[1];
          dVar2 = this->factor_;
          lVar12 = 0;
          do {
            local_f8[lVar12] = local_f8[lVar12] * dVar2;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          iVar4 = pSVar11->localIndex_;
          lVar12 = *(long *)((long)&(pSVar11->snapshotMan_->currentSnapshot_->atomData).torque.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
          *(double *)(lVar12 + 0x10 + (long)iVar4 * 0x18) = local_f8[2];
          pdVar1 = (double *)(lVar12 + (long)iVar4 * 0x18);
          *pdVar1 = local_f8[0];
          pdVar1[1] = local_f8[1];
        }
        ppSVar10 = ppSVar10 + 1;
      }
      pMVar8 = SimInfo::nextMolecule
                         ((this->super_RestraintForceModifier).super_ForceModifier.info_,&local_b0);
    } while (pMVar8 != (Molecule *)0x0);
  }
  pSVar5 = ((this->super_RestraintForceModifier).super_ForceModifier.info_)->sman_->currentSnapshot_
  ;
  RVar6 = Snapshot::getPotentialEnergy(pSVar5);
  Snapshot::setRawPotential(pSVar5,RVar6);
  local_b8 = Snapshot::getRestraintPotential(pSVar5);
  dVar2 = RVar6 * this->factor_;
  Snapshot::setPotentialEnergy(pSVar5,dVar2);
  Snapshot::getVirialTensor(&local_58,pSVar5);
  lVar12 = 0;
  do {
    *(undefined8 *)
     ((long)local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar12 + 0x10) =
         *(undefined8 *)
          ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar12 + 0x10);
    uVar7 = *(undefined8 *)
             ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
             + lVar12 + 8);
    *(undefined8 *)
     ((long)local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar12) = *(undefined8 *)
                ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                       [0] + lVar12);
    *(undefined8 *)
     ((long)local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar12 + 8) = uVar7;
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x48);
  dVar3 = this->factor_;
  padVar9 = (double (*) [3])&local_a8;
  lVar12 = 0;
  do {
    lVar13 = 0;
    do {
      (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar13] =
           (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).data_[0]
           [lVar13] * dVar3;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    lVar12 = lVar12 + 1;
    padVar9 = padVar9 + 1;
  } while (lVar12 != 3);
  Snapshot::setVirialTensor(pSVar5,&local_a8);
  uVar14 = 0;
  uVar15 = 0;
  local_d8[3] = 0.0;
  if ((this->simParam_->UseRestraints).super_ParameterBase.field_0x2b == '\x01') {
    RVar6 = RestraintForceModifier::doRestraints
                      (&this->super_RestraintForceModifier,1.0 - this->factor_);
    uVar14 = SUB84(RVar6,0);
    uVar15 = (undefined4)((ulong)RVar6 >> 0x20);
    local_d8[3] = (this->super_RestraintForceModifier).unscaledPotential_;
  }
  Snapshot::setPotentialEnergy(pSVar5,dVar2 + (double)CONCAT44(uVar15,uVar14));
  Snapshot::setRestraintPotential(pSVar5,local_b8 + local_d8[3]);
  return;
}

Assistant:

void ThermoIntegrationForceModifier::modifyForces() {
    Snapshot* curSnapshot;
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;
    Vector3d frc;
    Vector3d trq;
    Mat3x3d tempTau;

    // now scale forces and torques of all the sds
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        frc = sd->getFrc();
        frc *= factor_;
        sd->setFrc(frc);

        if (sd->isDirectional()) {
          trq = sd->getTrq();
          trq *= factor_;
          sd->setTrq(trq);
        }
      }
    }

    curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    // set rawPotential to be the unscaled potential energy
    RealType rawPot = curSnapshot->getPotentialEnergy();
    curSnapshot->setRawPotential(rawPot);

    RealType rp = curSnapshot->getRestraintPotential();

    // scale the potential and update the snapshot
    rawPot *= factor_;
    curSnapshot->setPotentialEnergy(rawPot);

    // scale the virial tensor
    tempTau = curSnapshot->getVirialTensor();
    tempTau *= factor_;
    curSnapshot->setVirialTensor(tempTau);

    // now, on to the applied restraining potentials (if needed):
    RealType scaledRestPot(0.0);
    RealType restPot(0.0);

    if (simParam_->getUseRestraints()) {
      // do restraints from RestraintForceModifier:
      scaledRestPot = doRestraints(1.0 - factor_);
      restPot       = getUnscaledPotential();
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &scaledRestPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &restPot, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // give the final values to the snapshot
    curSnapshot->setPotentialEnergy(rawPot + scaledRestPot);
    curSnapshot->setRestraintPotential(rp + restPot);
  }